

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void testing::internal::XmlUnitTestResultPrinter::OutputXmlTestInfo
               (ostream *stream,char *test_suite_name,TestInfo *test_info)

{
  size_type *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestResult *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  TestPartResult *pTVar8;
  long *plVar9;
  ostream *poVar10;
  undefined8 value;
  TimeInMillis ms;
  TimeInMillis ms_00;
  long lVar11;
  int i;
  _Alloc_hider _Var12;
  internal *this_00;
  char *pcVar13;
  int iVar14;
  string location;
  string summary;
  string detail;
  string kTestsuite;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_f0;
  undefined1 local_d0 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  string local_80;
  string local_60;
  undefined8 local_40;
  undefined8 local_38;
  
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_80,"testcase","");
  if (test_info->is_in_another_shard_ != false) goto LAB_00117804;
  std::__ostream_insert<char,std::char_traits<char>>(stream,"    <testcase",0xd);
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"name","");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_d0,(test_info->name_)._M_dataplus._M_p,
             (allocator<char> *)local_a0._M_local_buf);
  OutputXmlAttribute(stream,&local_80,&local_f0,(string *)local_d0);
  if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
    operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  pbVar3 = (test_info->value_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"value_param","");
    pbVar3 = (test_info->value_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var12._M_p = (char *)0x0;
    }
    else {
      _Var12._M_p = (pbVar3->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,_Var12._M_p,(allocator<char> *)local_a0._M_local_buf);
    OutputXmlAttribute(stream,&local_80,&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  pbVar3 = (test_info->type_param_)._M_t.
           super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  if ((pbVar3 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
     ((pbVar3->_M_dataplus)._M_p != (pointer)0x0)) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"type_param","");
    pbVar3 = (test_info->type_param_)._M_t.
             super___uniq_ptr_impl<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    if (pbVar3 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      _Var12._M_p = (char *)0x0;
    }
    else {
      _Var12._M_p = (pbVar3->_M_dataplus)._M_p;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,_Var12._M_p,(allocator<char> *)local_a0._M_local_buf);
    OutputXmlAttribute(stream,&local_80,&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  if (FLAGS_gtest_list_tests == '\x01') {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"file","");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_d0,(test_info->location_).file._M_dataplus._M_p,
               (allocator<char> *)local_a0._M_local_buf);
    OutputXmlAttribute(stream,&local_80,&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"line","");
    local_a0._M_allocated_capacity._0_4_ = (test_info->location_).line;
    StreamableToString<int>((string *)local_d0,(int *)local_a0._M_local_buf);
    OutputXmlAttribute(stream,&local_80,&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
LAB_001177f0:
    pcVar13 = " />\n";
    lVar11 = 4;
  }
  else {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    local_d0._32_8_ = test_suite_name;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"status","");
    pcVar13 = "notrun";
    if ((ulong)test_info->should_run_ != 0) {
      pcVar13 = "run";
    }
    local_d0._0_8_ = local_d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_d0,pcVar13,pcVar13 + ((ulong)test_info->should_run_ ^ 1) * 3 + 3);
    OutputXmlAttribute(stream,&local_80,&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    this = &test_info->result_;
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"result","");
    local_38 = this;
    if (test_info->should_run_ == true) {
      bVar5 = TestResult::Skipped(this);
      pcVar13 = "completed";
      if (bVar5) {
        pcVar13 = "skipped";
      }
    }
    else {
      pcVar13 = "suppressed";
    }
    local_d0._0_8_ = local_d0 + 0x10;
    sVar7 = strlen(pcVar13);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,pcVar13,pcVar13 + sVar7);
    OutputXmlAttribute(stream,&local_80,&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    uVar4 = local_d0._32_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"time","");
    FormatTimeInMillisAsSeconds_abi_cxx11_
              ((string *)local_d0,(internal *)(test_info->result_).elapsed_time_,ms);
    OutputXmlAttribute(stream,&local_80,&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"timestamp","");
    FormatEpochTimeInMillisAsIso8601_abi_cxx11_
              ((string *)local_d0,(internal *)(test_info->result_).start_timestamp_,ms_00);
    OutputXmlAttribute(stream,&local_80,&local_f0,(string *)local_d0);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"classname","");
    value = local_d0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)value,(char *)uVar4,(allocator<char> *)local_a0._M_local_buf);
    OutputXmlAttribute(stream,&local_80,&local_f0,(string *)value);
    if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
      operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((int)((ulong)((long)(test_info->result_).test_part_results_.
                            super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(test_info->result_).test_part_results_.
                           super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249 < 1) {
LAB_001177a8:
      if ((int)((ulong)((long)(test_info->result_).test_properties_.
                              super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(test_info->result_).test_properties_.
                             super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6) == 0)
      goto LAB_001177f0;
      std::__ostream_insert<char,std::char_traits<char>>(stream,">\n",2);
    }
    else {
      i = 0;
      iVar14 = 0;
      local_d0._32_8_ = stream;
      local_40 = test_info;
      do {
        iVar6 = (int)value;
        pTVar8 = TestResult::GetTestPartResult((TestResult *)local_38,i);
        if (pTVar8->type_ - kNonFatalFailure < 2) {
          if (iVar14 == 0) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_d0._32_8_,">\n",2);
          }
          this_00 = (internal *)(pTVar8->file_name_)._M_string_length;
          if (this_00 != (internal *)0x0) {
            this_00 = (internal *)(pTVar8->file_name_)._M_dataplus._M_p;
          }
          FormatCompilerIndependentFileLocation_abi_cxx11_
                    (&local_f0,this_00,(char *)(ulong)(uint)pTVar8->line_number_,iVar6);
          local_a0._M_allocated_capacity = (size_type)&local_90;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_a0,local_f0._M_dataplus._M_p,
                     local_f0._M_dataplus._M_p + local_f0._M_string_length);
          std::__cxx11::string::append(local_a0._M_local_buf);
          plVar9 = (long *)std::__cxx11::string::append(local_a0._M_local_buf);
          psVar1 = (size_type *)(plVar9 + 2);
          if ((size_type *)*plVar9 == psVar1) {
            local_d0._16_8_ = *psVar1;
            local_d0._24_8_ = plVar9[3];
            local_d0._0_8_ = local_d0 + 0x10;
          }
          else {
            local_d0._16_8_ = *psVar1;
            local_d0._0_8_ = (size_type *)*plVar9;
          }
          local_d0._8_8_ = plVar9[1];
          *plVar9 = (long)psVar1;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_allocated_capacity != &local_90) {
            operator_delete((void *)local_a0._M_allocated_capacity,
                            (ulong)(local_90._M_allocated_capacity + 1));
          }
          uVar4 = local_d0._32_8_;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_d0._32_8_,"      <failure message=\"",0x18);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_60,(char *)local_d0._0_8_,(allocator<char> *)(local_d0 + 0x2f)
                    );
          EscapeXml((string *)&local_a0,&local_60,true);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)uVar4,(char *)local_a0._M_allocated_capacity,
                               local_a0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" type=\"\">",10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_allocated_capacity != &local_90) {
            operator_delete((void *)local_a0._M_allocated_capacity,
                            (ulong)(local_90._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_60,local_f0._M_dataplus._M_p,
                     local_f0._M_dataplus._M_p + local_f0._M_string_length);
          std::__cxx11::string::append((char *)&local_60);
          plVar9 = (long *)std::__cxx11::string::append((char *)&local_60);
          paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 == paVar2) {
            local_90._M_allocated_capacity = paVar2->_M_allocated_capacity;
            local_90._8_8_ = plVar9[3];
            local_a0._M_allocated_capacity = (size_type)&local_90;
          }
          else {
            local_90._M_allocated_capacity = paVar2->_M_allocated_capacity;
            local_a0._M_allocated_capacity =
                 (size_type)
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)*plVar9;
          }
          local_a0._8_8_ = plVar9[1];
          *plVar9 = (long)paVar2;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          RemoveInvalidXmlCharacters(&local_60,(string *)&local_a0);
          OutputXmlCDataSection((ostream *)local_d0._32_8_,local_60._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_60._M_dataplus._M_p != &local_60.field_2) {
            operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_d0._32_8_,"</failure>\n",0xb);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a0._M_allocated_capacity != &local_90) {
            operator_delete((void *)local_a0._M_allocated_capacity,
                            (ulong)(local_90._M_allocated_capacity + 1));
          }
          if ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10) {
            operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
          }
          iVar14 = iVar14 + 1;
        }
        i = i + 1;
        iVar6 = (int)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(local_40 + 0xd0))->_M_allocated_capacity -
                      (long)(((vector<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                               *)(local_40 + 200))->
                            super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4);
        value = local_40;
      } while (SBORROW4(i,iVar6 * -0x49249249) != i + iVar6 * 0x49249249 < 0);
      stream = (ostream *)local_d0._32_8_;
      test_info = (TestInfo *)local_40;
      if (iVar14 == 0) goto LAB_001177a8;
    }
    OutputXmlTestProperties(stream,(TestResult *)local_38);
    pcVar13 = "    </testcase>\n";
    lVar11 = 0x10;
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,pcVar13,lVar11);
LAB_00117804:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void XmlUnitTestResultPrinter::OutputXmlTestInfo(::std::ostream* stream,
                                                 const char* test_suite_name,
                                                 const TestInfo& test_info) {
  const TestResult& result = *test_info.result();
  const std::string kTestsuite = "testcase";

  if (test_info.is_in_another_shard()) {
    return;
  }

  *stream << "    <testcase";
  OutputXmlAttribute(stream, kTestsuite, "name", test_info.name());

  if (test_info.value_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "value_param",
                       test_info.value_param());
  }
  if (test_info.type_param() != nullptr) {
    OutputXmlAttribute(stream, kTestsuite, "type_param",
                       test_info.type_param());
  }
  if (GTEST_FLAG(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "file", test_info.file());
    OutputXmlAttribute(stream, kTestsuite, "line",
                       StreamableToString(test_info.line()));
    *stream << " />\n";
    return;
  }

  OutputXmlAttribute(stream, kTestsuite, "status",
                     test_info.should_run() ? "run" : "notrun");
  OutputXmlAttribute(stream, kTestsuite, "result",
                     test_info.should_run()
                         ? (result.Skipped() ? "skipped" : "completed")
                         : "suppressed");
  OutputXmlAttribute(stream, kTestsuite, "time",
                     FormatTimeInMillisAsSeconds(result.elapsed_time()));
  OutputXmlAttribute(
      stream, kTestsuite, "timestamp",
      FormatEpochTimeInMillisAsIso8601(result.start_timestamp()));
  OutputXmlAttribute(stream, kTestsuite, "classname", test_suite_name);

  int failures = 0;
  for (int i = 0; i < result.total_part_count(); ++i) {
    const TestPartResult& part = result.GetTestPartResult(i);
    if (part.failed()) {
      if (++failures == 1) {
        *stream << ">\n";
      }
      const std::string location =
          internal::FormatCompilerIndependentFileLocation(part.file_name(),
                                                          part.line_number());
      const std::string summary = location + "\n" + part.summary();
      *stream << "      <failure message=\""
              << EscapeXmlAttribute(summary.c_str())
              << "\" type=\"\">";
      const std::string detail = location + "\n" + part.message();
      OutputXmlCDataSection(stream, RemoveInvalidXmlCharacters(detail).c_str());
      *stream << "</failure>\n";
    }
  }

  if (failures == 0 && result.test_property_count() == 0) {
    *stream << " />\n";
  } else {
    if (failures == 0) {
      *stream << ">\n";
    }
    OutputXmlTestProperties(stream, result);
    *stream << "    </testcase>\n";
  }
}